

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O3

void __thiscall AInventory::BecomeItem(AInventory *this)

{
  ActorFlags *pAVar1;
  FState *newstate;
  FName local_14;
  
  if (((this->super_AActor).flags.Value & 0x18) == 0) {
    AActor::UnlinkFromWorld(&this->super_AActor);
    if (sector_list != (msecnode_t *)0x0) {
      P_DelSeclist(sector_list);
      sector_list = (msecnode_t *)0x0;
    }
    pAVar1 = &(this->super_AActor).flags;
    *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 0x18;
    AActor::LinkToWorld(&this->super_AActor,false,(sector_t *)0x0);
  }
  AActor::RemoveFromHash(&this->super_AActor);
  pAVar1 = &(this->super_AActor).flags;
  *(byte *)&pAVar1->Value = (byte)pAVar1->Value & 0xfe;
  DThinker::ChangeStatNum((DThinker *)this,0x25);
  FName::NameManager::FindName(&FName::NameData,"Held",false);
  newstate = AActor::FindState(&this->super_AActor,&local_14);
  AActor::SetState(&this->super_AActor,newstate,false);
  return;
}

Assistant:

void AInventory::BecomeItem ()
{
	if (!(flags & (MF_NOBLOCKMAP|MF_NOSECTOR)))
	{
		UnlinkFromWorld ();
		if (sector_list)
		{
			P_DelSeclist (sector_list);
			sector_list = NULL;
		}
		flags |= MF_NOBLOCKMAP|MF_NOSECTOR;
		LinkToWorld ();
	}
	RemoveFromHash ();
	flags &= ~MF_SPECIAL;
	ChangeStatNum(STAT_INVENTORY);
	SetState (FindState("Held"));
}